

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O0

bool __thiscall
FadBinaryMul<FadExpr<FadBinaryMul<FadCst<int>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>
::hasFastAccess(FadBinaryMul<FadExpr<FadBinaryMul<FadCst<int>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>
                *this)

{
  bool bVar1;
  undefined1 local_9;
  
  bVar1 = FadExpr<FadBinaryMul<FadCst<int>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>::
          hasFastAccess((FadExpr<FadBinaryMul<FadCst<int>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>
                         *)0x15c8b5a);
  local_9 = false;
  if (bVar1) {
    local_9 = FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>::hasFastAccess
                        ((FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_> *)0x15c8b76);
  }
  return local_9;
}

Assistant:

bool hasFastAccess() const { return left_.hasFastAccess() && right_.hasFastAccess();}